

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O0

void strbuffer_resize_if_needed(strbuffer_t *buffer)

{
  int iVar1;
  char *pcVar2;
  int new_capacity;
  strbuffer_t *buffer_local;
  
  if (buffer->capacity <= buffer->pos) {
    iVar1 = buffer->capacity + buffer->increment;
    pcVar2 = (char *)realloc(buffer->data,(long)iVar1);
    buffer->data = pcVar2;
    buffer->capacity = iVar1;
  }
  return;
}

Assistant:

void strbuffer_resize_if_needed(strbuffer_t* buffer)
{
    if (buffer->pos < buffer->capacity)
        return;

    int new_capacity = buffer->capacity + buffer->increment;
    //printf("Resizing to %d\n", new_capacity);
    buffer->data = (char*) realloc(buffer->data, new_capacity * sizeof(char));
    buffer->capacity = new_capacity;
}